

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpAddress.cpp
# Opt level: O0

void getLocalIP(char *addressBuffer)

{
  void *tmpAddrPtr;
  ifaddrs *ifAddrStruct;
  char *addressBuffer_local;
  
  tmpAddrPtr = (void *)0x0;
  ifAddrStruct = (ifaddrs *)addressBuffer;
  getifaddrs(&tmpAddrPtr);
  for (; tmpAddrPtr != (void *)0x0; tmpAddrPtr = *tmpAddrPtr) {
    if (**(short **)((long)tmpAddrPtr + 0x18) == 2) {
      inet_ntop(2,(void *)(*(long *)((long)tmpAddrPtr + 0x18) + 4),(char *)ifAddrStruct,0x10);
    }
  }
  return;
}

Assistant:

void getLocalIP(char* addressBuffer) {
    struct ifaddrs * ifAddrStruct=NULL;
    void * tmpAddrPtr=NULL;
    getifaddrs(&ifAddrStruct);
    while (ifAddrStruct!=NULL) {
        if (ifAddrStruct->ifa_addr->sa_family==AF_INET) { // check it is IP4
            tmpAddrPtr=&((struct sockaddr_in *)ifAddrStruct->ifa_addr)->sin_addr;
            inet_ntop(AF_INET, tmpAddrPtr, addressBuffer, INET_ADDRSTRLEN);
        }
        ifAddrStruct=ifAddrStruct->ifa_next;
    }
//    cout << addressBuffer << endl;
}